

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O3

pair<unsigned_long,_signed_char> __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
::_Pool::Release(_Pool *this,
                Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                *pNode)

{
  char cVar1;
  unsigned_long uVar2;
  Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
  *pNVar3;
  pointer pNVar4;
  undefined8 unaff_RBP;
  pair<unsigned_long,_signed_char> pVar5;
  
  uVar2 = (pNode->_value).first;
  cVar1 = (pNode->_value).second;
  pNVar3 = this->cache;
  this->cache = pNode;
  if ((pNVar3 != (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                  *)0x0) &&
     (pNVar4 = (pNVar3->_nodeRefs)._nodes.
               super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start, pNVar4 != (pointer)0x0)) {
    operator_delete(pNVar4);
  }
  operator_delete(pNVar3);
  pVar5._8_8_ = CONCAT71((int7)((ulong)unaff_RBP >> 8),cVar1) & 0xffffffff;
  pVar5.first = uVar2;
  return pVar5;
}

Assistant:

T Release(Node *pNode) {
			T result = pNode->value();
			std::swap(pNode, cache);
			delete pNode;
			return result;
		}